

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::SetStorageBuffer
          (Resource *this,RefCntAutoPtr<Diligent::IDeviceObject> *_pBufferView)

{
  bool bVar1;
  BIND_FLAGS BVar2;
  Char *pCVar3;
  BufferViewVkImpl *this_00;
  BufferViewDesc *Args;
  BufferVkImpl *this_01;
  BufferDesc *Args_00;
  char (*in_RCX) [193];
  char (*in_R8) [96];
  char **in_R9;
  undefined1 local_158 [8];
  string msg_7;
  string msg_6;
  undefined1 local_110 [8];
  string msg_5;
  string msg_4;
  undefined1 local_c8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  BufferDesc *BuffDesc;
  BufferVkImpl *pBuffVk;
  BufferViewDesc *ViewDesc;
  BufferViewVkImpl *pBuffViewVk;
  undefined1 local_38 [8];
  string msg;
  RefCntAutoPtr<Diligent::IDeviceObject> *_pBufferView_local;
  Resource *this_local;
  
  msg.field_2._8_8_ = _pBufferView;
  if ((((this->Type != StorageBuffer) && (this->Type != StorageBufferDynamic)) &&
      (this->Type != StorageBuffer_ReadOnly)) && (this->Type != StorageBufferDynamic_ReadOnly)) {
    FormatString<char[26],char[193]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Type == DescriptorType::StorageBuffer || Type == DescriptorType::StorageBufferDynamic || Type == DescriptorType::StorageBuffer_ReadOnly || Type == DescriptorType::StorageBufferDynamic_ReadOnly"
               ,in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetStorageBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xed);
    std::__cxx11::string::~string((string *)local_38);
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=
            (&this->pObject,(RefCntAutoPtr<Diligent::IDeviceObject> *)msg.field_2._8_8_);
  this->BufferDynamicOffset = 0;
  this->BufferBaseOffset = 0;
  this->BufferRangeSize = 0;
  bVar1 = RefCntAutoPtr<Diligent::IDeviceObject>::operator!(&this->pObject);
  if (!bVar1) {
    this_00 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                        (&this->pObject);
    Args = DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                      *)this_00);
    this->BufferBaseOffset = Args->ByteOffset;
    this->BufferRangeSize = Args->ByteWidth;
    this_01 = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer<Diligent::BufferVkImpl_const>
                        (&this_00->super_BufferViewBase<Diligent::EngineVkImplTraits>);
    Args_00 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                         *)this_01);
    if (((this->Type != StorageBufferDynamic) && (this->Type != StorageBufferDynamic_ReadOnly)) &&
       (Args_00->Usage == USAGE_DYNAMIC)) {
      FormatString<char[98]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [98])
                 "Dynamic buffer must be used with StorageBufferDynamic or StorageBufferDynamic_ReadOnly descriptor"
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x103);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if (Args_00->Size < this->BufferBaseOffset + this->BufferRangeSize) {
      FormatString<char[45]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [45])"Specified view range is out of buffer bounds");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x106);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if ((this->Type == StorageBuffer_ReadOnly) || (this->Type == StorageBufferDynamic_ReadOnly)) {
      if (Args->ViewType != BUFFER_VIEW_SHADER_RESOURCE) {
        msg_4.field_2._8_8_ = GetBufferViewTypeLiteralName(Args->ViewType);
        in_R8 = (char (*) [96])((long)&msg_4.field_2 + 8);
        FormatString<char[33],char_const*,char[96],char_const*>
                  ((string *)local_c8,(Diligent *)"Attempting to bind buffer view \'",
                   (char (*) [33])Args,
                   (char **)
                   "\' as read-only storage buffer. Expected view type is BUFFER_VIEW_SHADER_RESOURCE. Actual type: "
                   ,in_R8,in_R9);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x10f);
        std::__cxx11::string::~string((string *)local_c8);
      }
      BVar2 = Diligent::operator&(Args_00->BindFlags,BIND_SHADER_RESOURCE);
      if (BVar2 == BIND_NONE) {
        FormatString<char[9],char_const*,char[87]>
                  ((string *)((long)&msg_5.field_2 + 8),(Diligent *)0xc0c559,(char (*) [9])Args_00,
                   (char **)
                   "\' being set as read-only storage buffer was not created with BIND_SHADER_RESOURCE flag"
                   ,(char (*) [87])in_R8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x111);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
    }
    else if ((this->Type == StorageBuffer) || (this->Type == StorageBufferDynamic)) {
      if (Args->ViewType != BUFFER_VIEW_UNORDERED_ACCESS) {
        msg_6.field_2._8_8_ = GetBufferViewTypeLiteralName(Args->ViewType);
        in_R8 = (char (*) [96])((long)&msg_6.field_2 + 8);
        FormatString<char[33],char_const*,char[96],char_const*>
                  ((string *)local_110,(Diligent *)"Attempting to bind buffer view \'",
                   (char (*) [33])Args,
                   (char **)
                   "\' as writable storage buffer. Expected view type is BUFFER_VIEW_UNORDERED_ACCESS. Actual type: "
                   ,in_R8,in_R9);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x117);
        std::__cxx11::string::~string((string *)local_110);
      }
      BVar2 = Diligent::operator&(Args_00->BindFlags,BIND_UNORDERED_ACCESS);
      if (BVar2 == BIND_NONE) {
        FormatString<char[9],char_const*,char[87]>
                  ((string *)((long)&msg_7.field_2 + 8),(Diligent *)0xc0c559,(char (*) [9])Args_00,
                   (char **)
                   "\' being set as writable storage buffer was not created with BIND_UNORDERED_ACCESS flag"
                   ,(char (*) [87])in_R8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x119);
        std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
      }
    }
    else {
      FormatString<char[25]>((string *)local_158,(char (*) [25])"Unexpected resource type");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x11d);
      std::__cxx11::string::~string((string *)local_158);
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetStorageBuffer(RefCntAutoPtr<IDeviceObject>&& _pBufferView)
{
    VERIFY_EXPR(Type == DescriptorType::StorageBuffer ||
                Type == DescriptorType::StorageBufferDynamic ||
                Type == DescriptorType::StorageBuffer_ReadOnly ||
                Type == DescriptorType::StorageBufferDynamic_ReadOnly);

    pObject = std::move(_pBufferView);

    BufferDynamicOffset = 0; // It is essential to reset dynamic offset
    BufferBaseOffset    = 0;
    BufferRangeSize     = 0;

    if (!pObject)
        return;

    const BufferViewVkImpl* pBuffViewVk = pObject.ConstPtr<BufferViewVkImpl>();
    const BufferViewDesc&   ViewDesc    = pBuffViewVk->GetDesc();

    BufferBaseOffset = ViewDesc.ByteOffset;
    BufferRangeSize  = ViewDesc.ByteWidth;

#ifdef DILIGENT_DEBUG
    {
        const BufferVkImpl* pBuffVk  = pBuffViewVk->GetBuffer<const BufferVkImpl>();
        const BufferDesc&   BuffDesc = pBuffVk->GetDesc();
        VERIFY(Type == DescriptorType::StorageBufferDynamic || Type == DescriptorType::StorageBufferDynamic_ReadOnly || BuffDesc.Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with StorageBufferDynamic or StorageBufferDynamic_ReadOnly descriptor");

        VERIFY(BufferBaseOffset + BufferRangeSize <= BuffDesc.Size,
               "Specified view range is out of buffer bounds");

        // VK_DESCRIPTOR_TYPE_STORAGE_BUFFER or VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC descriptor type
        // require buffer to be created with VK_BUFFER_USAGE_STORAGE_BUFFER_BIT (13.2.4)
        if (Type == DescriptorType::StorageBuffer_ReadOnly || Type == DescriptorType::StorageBufferDynamic_ReadOnly)
        {
            // HLSL buffer SRVs are mapped to read-only storage buffers in SPIR-V
            VERIFY(ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE, "Attempting to bind buffer view '", ViewDesc.Name,
                   "' as read-only storage buffer. Expected view type is BUFFER_VIEW_SHADER_RESOURCE. Actual type: ",
                   GetBufferViewTypeLiteralName(ViewDesc.ViewType));
            VERIFY((BuffDesc.BindFlags & BIND_SHADER_RESOURCE) != 0,
                   "Buffer '", BuffDesc.Name, "' being set as read-only storage buffer was not created with BIND_SHADER_RESOURCE flag");
        }
        else if (Type == DescriptorType::StorageBuffer || Type == DescriptorType::StorageBufferDynamic)
        {
            VERIFY(ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS, "Attempting to bind buffer view '", ViewDesc.Name,
                   "' as writable storage buffer. Expected view type is BUFFER_VIEW_UNORDERED_ACCESS. Actual type: ",
                   GetBufferViewTypeLiteralName(ViewDesc.ViewType));
            VERIFY((BuffDesc.BindFlags & BIND_UNORDERED_ACCESS) != 0,
                   "Buffer '", BuffDesc.Name, "' being set as writable storage buffer was not created with BIND_UNORDERED_ACCESS flag");
        }
        else
        {
            UNEXPECTED("Unexpected resource type");
        }
    }
#endif
}